

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O2

size_t __thiscall
proto2_unittest::TestExtensionOrderings2_TestExtensionOrderings3::ByteSizeLong
          (TestExtensionOrderings2_TestExtensionOrderings3 *this)

{
  size_t sVar1;
  
  if ((undefined1  [16])((undefined1  [16])this->field_0 & (undefined1  [16])0x1) ==
      (undefined1  [16])0x0) {
    sVar1 = 0;
  }
  else {
    sVar1 = google::protobuf::internal::WireFormatLite::StringSize
                      ((string *)
                       ((ulong)(this->field_0)._impl_.my_string_.tagged_ptr_.ptr_ &
                       0xfffffffffffffffc));
    sVar1 = sVar1 + 1;
  }
  sVar1 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar1,&(this->field_0)._impl_._cached_size_);
  return sVar1;
}

Assistant:

::size_t TestExtensionOrderings2_TestExtensionOrderings3::ByteSizeLong() const {
  const TestExtensionOrderings2_TestExtensionOrderings3& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestExtensionOrderings2.TestExtensionOrderings3)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

   {
    // string my_string = 1;
    cached_has_bits = this_._impl_._has_bits_[0];
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_my_string());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}